

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O3

int jx9Builtin_zip_open(jx9_context *pCtx,int nArg,jx9_value **apArg)

{
  uint uVar1;
  int iVar2;
  sxi32 sVar3;
  jx9_io_stream *pStream;
  SyArchive *pArch;
  SyArchiveEntry **__s;
  void *pHandle;
  char *pcVar4;
  jx9_value *pObj;
  SyString *pFuncName;
  jx9_vm *pjVar5;
  char *zFile;
  int nLen;
  
  if ((nArg < 1) || (((*apArg)->iFlags & 1) == 0)) {
    pjVar5 = pCtx->pVm;
    pFuncName = &pCtx->pFunc->sName;
    pcVar4 = "Expecting a file path";
LAB_0013b752:
    jx9VmThrowError(pjVar5,pFuncName,2,pcVar4);
  }
  else {
    zFile = jx9_value_to_string(*apArg,&nLen);
    pjVar5 = pCtx->pVm;
    pStream = jx9VmGetStreamDevice(pjVar5,&zFile,nLen);
    if (pStream == (jx9_io_stream *)0x0) {
      pFuncName = &pCtx->pFunc->sName;
      pcVar4 = "No such stream device, JX9 is returning FALSE";
      goto LAB_0013b752;
    }
    pArch = (SyArchive *)jx9_context_alloc_chunk(pCtx,0x80,1,0);
    pjVar5 = pCtx->pVm;
    if (pArch == (SyArchive *)0x0) {
      pFuncName = &pCtx->pFunc->sName;
      pcVar4 = "JX9 is running out of memory";
      goto LAB_0013b752;
    }
    *(undefined8 *)&pArch->nCentralSize = 0;
    pArch->pUserData = (void *)0x0;
    pArch->nSize = 0;
    pArch->nEntry = 0;
    pArch->nLoaded = 0;
    pArch->nCentralOfft = 0;
    pArch->xCmp = (ProcRawStrCmp)0x0;
    pArch->xHash = (ProcHash)0x0;
    pArch->pList = (SyArchiveEntry *)0x0;
    pArch->apHash = (SyArchiveEntry **)0x0;
    pArch->pAllocator = (SyMemBackend *)0x0;
    pArch->pCursor = (SyArchiveEntry *)0x0;
    *(undefined8 *)&pArch->nMagic = 0;
    __s = (SyArchiveEntry **)SyMemBackendAlloc(&pjVar5->sAllocator,0x200);
    if (__s != (SyArchiveEntry **)0x0) {
      memset(__s,0,0x200);
      pArch->apHash = __s;
      pArch->xHash = SyBinHash;
      pArch->xCmp = ArchiveHashCmp;
      pArch->nSize = 0x40;
      pArch->pAllocator = &pjVar5->sAllocator;
      pArch->nMagic = 0xdead635a;
    }
    pcVar4 = zFile;
    pjVar5 = pCtx->pVm;
    if (pStream == pjVar5->pDefStream) {
      iVar2 = UnixVfs_Mmap(zFile,&pArch[1].pCursor,(jx9_int64 *)&pArch[1].pList);
      if (iVar2 != 0) {
        pjVar5 = pCtx->pVm;
        goto LAB_0013b883;
      }
      sVar3 = SyZipExtractFromBuf(pArch,(char *)pArch[1].pCursor,*(sxu32 *)&pArch[1].pList);
      if (sVar3 == 0) {
        *(undefined4 *)&pArch[1].pAllocator = 1;
        pArch[1].apHash = (SyArchiveEntry **)&sUnixVfs;
LAB_0013b9bd:
        pArch->pCursor = pArch->pList;
        pObj = pCtx->pRet;
        jx9MemObjRelease(pObj);
        (pObj->x).pOther = pArch;
        uVar1 = 0x100;
        goto LAB_0013b774;
      }
      munmap(pArch[1].pCursor,(size_t)pArch[1].pList);
LAB_0013b977:
      jx9_context_free_chunk(pCtx,pArch);
    }
    else {
LAB_0013b883:
      pHandle = jx9StreamOpenHandle(pjVar5,pStream,pcVar4,1,0,(jx9_value *)0x0,0,(int *)0x0);
      if (pHandle != (void *)0x0) {
        pjVar5 = pCtx->pVm;
        pArch[1].pList = (SyArchiveEntry *)0x0;
        pArch[1].apHash = (SyArchiveEntry **)0x0;
        pArch[1].pCursor = (SyArchiveEntry *)pjVar5;
        *(undefined4 *)&pArch[1].xCmp = 0;
        jx9StreamReadWholeFile(pHandle,pStream,(SyBlob *)&pArch[1].pCursor);
        if (*(sxu32 *)&pArch[1].apHash == 0) {
          *(undefined4 *)&pArch[1].pAllocator = 2;
          if (pStream->xClose != (_func_void_void_ptr *)0x0) {
            (*pStream->xClose)(pHandle);
          }
        }
        else {
          sVar3 = SyZipExtractFromBuf(pArch,(char *)pArch[1].pList,*(sxu32 *)&pArch[1].apHash);
          *(undefined4 *)&pArch[1].pAllocator = 2;
          if (pStream->xClose != (_func_void_void_ptr *)0x0) {
            (*pStream->xClose)(pHandle);
          }
          if (sVar3 == 0) goto LAB_0013b9bd;
        }
        SyBlobRelease((SyBlob *)&pArch[1].pCursor);
        goto LAB_0013b977;
      }
      jx9_context_throw_error_format(pCtx,1,"IO error while opening \'%s\'",pcVar4);
    }
  }
  pObj = pCtx->pRet;
  jx9MemObjRelease(pObj);
  (pObj->x).rVal = 0.0;
  uVar1 = 8;
LAB_0013b774:
  pObj->iFlags = pObj->iFlags & 0xfffffe90U | uVar1;
  return 0;
}

Assistant:

static int jx9Builtin_zip_open(jx9_context *pCtx, int nArg, jx9_value **apArg)
{
	const jx9_io_stream *pStream;
	SyArchive *pArchive;
	zip_raw_data *pRaw;
	const char *zFile;
	SyBlob *pContents;
	void *pHandle;
	int nLen;
	sxi32 rc;
	if( nArg < 1 || !jx9_value_is_string(apArg[0]) ){
		/* Missing/Invalid arguments, return FALSE */
		jx9_context_throw_error(pCtx, JX9_CTX_WARNING, "Expecting a file path");
		jx9_result_bool(pCtx, 0);
		return JX9_OK;
	}
	/* Extract the file path */
	zFile = jx9_value_to_string(apArg[0], &nLen);
	/* Point to the target IO stream device */
	pStream = jx9VmGetStreamDevice(pCtx->pVm, &zFile, nLen);
	if( pStream == 0 ){
		jx9_context_throw_error(pCtx, JX9_CTX_WARNING, "No such stream device, JX9 is returning FALSE");
		jx9_result_bool(pCtx, 0);
		return JX9_OK;
	}
	/* Create an in-memory archive */
	pArchive = (SyArchive *)jx9_context_alloc_chunk(pCtx, sizeof(SyArchive)+sizeof(zip_raw_data), TRUE, FALSE);
	if( pArchive == 0 ){
		jx9_context_throw_error(pCtx, JX9_CTX_WARNING, "JX9 is running out of memory");
		jx9_result_bool(pCtx, 0);
		return JX9_OK;
	}
	pRaw = (zip_raw_data *)&pArchive[1];
	/* Initialize the archive */
	SyArchiveInit(pArchive, &pCtx->pVm->sAllocator, 0, 0);
	/* Extract the default stream */
	if( pStream == pCtx->pVm->pDefStream /* file:// stream*/){
		const jx9_vfs *pVfs;
		/* Try to get a memory view of the whole file since ZIP files
		 * tends to be very big this days, this is a huge performance win.
		 */
		pVfs = jx9ExportBuiltinVfs();
		if( pVfs && pVfs->xMmap ){
			rc = pVfs->xMmap(zFile, &pRaw->raw.mmap.pMap, &pRaw->raw.mmap.nSize);
			if( rc == JX9_OK ){
				/* Nice, Extract the whole archive */
				rc = SyZipExtractFromBuf(pArchive, (const char *)pRaw->raw.mmap.pMap, (sxu32)pRaw->raw.mmap.nSize);
				if( rc != SXRET_OK ){
					if( pVfs->xUnmap ){
						pVfs->xUnmap(pRaw->raw.mmap.pMap, pRaw->raw.mmap.nSize);
					}
					/* Release the allocated chunk */
					jx9_context_free_chunk(pCtx, pArchive);
					/* Something goes wrong with this ZIP archive, return FALSE */
					jx9_result_bool(pCtx, 0);
					return JX9_OK;
				}
				/* Archive successfully opened */
				pRaw->iType = ZIP_RAW_DATA_MMAPED;
				pRaw->raw.mmap.pVfs = pVfs;
				goto success;
			}
		}
		/* FALL THROUGH */
	}
	/* Try to open the file in read-only mode */
	pHandle = jx9StreamOpenHandle(pCtx->pVm, pStream, zFile, JX9_IO_OPEN_RDONLY, FALSE, 0, FALSE, 0);
	if( pHandle == 0 ){
		jx9_context_throw_error_format(pCtx, JX9_CTX_ERR, "IO error while opening '%s'", zFile);
		jx9_result_bool(pCtx, 0);
		return JX9_OK;
	}
	pContents = &pRaw->raw.sBlob;
	SyBlobInit(pContents, &pCtx->pVm->sAllocator);
	/* Read the whole file */
	jx9StreamReadWholeFile(pHandle, pStream, pContents);
	/* Assume an invalid ZIP file */
	rc = SXERR_INVALID;
	if( SyBlobLength(pContents) > 0 ){
		/* Extract archive entries */
		rc = SyZipExtractFromBuf(pArchive, (const char *)SyBlobData(pContents), SyBlobLength(pContents));
	}
	pRaw->iType = ZIP_RAW_DATA_MEMBUF;
	/* Close the stream */
	jx9StreamCloseHandle(pStream, pHandle);
	if( rc != SXRET_OK ){
		/* Release the working buffer */
		SyBlobRelease(pContents);
		/* Release the allocated chunk */
		jx9_context_free_chunk(pCtx, pArchive);
		/* Something goes wrong with this ZIP archive, return FALSE */
		jx9_result_bool(pCtx, 0);
		return JX9_OK;
	}
success:
	/* Reset the loop cursor */
	SyArchiveResetLoopCursor(pArchive);
	/* Return the in-memory archive as a resource handle */
	jx9_result_resource(pCtx, pArchive);
	return JX9_OK;
}